

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Parser::ParseIncDec(Parser *this)

{
  Opcode opcode;
  bool bVar1;
  bool bVar2;
  mapped_type *pmVar3;
  RuntimeID RVar4;
  char *args;
  char *format;
  String varName;
  PropertyName local_d8;
  PropertyName propName;
  
  bVar1 = Accept(this,Increment);
  if (!bVar1) {
    Expect(this,Decrement,(char *)0x0);
  }
  PropertyName::PropertyName(&propName);
  varName._M_dataplus._M_p = (pointer)&varName.field_2;
  varName._M_string_length = 0;
  varName.field_2._M_local_buf[0] = '\0';
  bVar2 = CheckProperty(this,(size_t *)0x0);
  if (bVar2) {
    ParsePropertyName(&local_d8,this);
    PropertyName::operator=(&propName,&local_d8);
    PropertyName::~PropertyName(&local_d8);
    if (propName.m_readOnly == false) {
      EmitOpcode(this,PushProp);
      BinaryWriter::Write(&this->m_writer,propName.m_id);
      local_d8.m_id = propName.m_id;
      pmVar3 = std::
               map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
               ::operator[](&this->m_idNameMap,&local_d8.m_id);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_assign
                (pmVar3,&propName.m_name);
LAB_001d0e67:
      bVar2 = Accept(this,By);
      if (bVar2) {
        ParseExpression(this);
      }
      else {
        EmitOpcode(this,PushVal);
        Jinx::Variant::Variant((Variant *)&local_d8,1);
        Jinx::Variant::Write((Variant *)&local_d8,&this->m_writer);
        Jinx::Variant::~Variant((Variant *)&local_d8);
      }
      opcode = Decrement;
      if (bVar1) {
        opcode = Increment;
      }
      EmitOpcode(this,opcode);
      if (propName.m_name._M_string_length == 0) {
        EmitOpcode(this,SetVar);
        RVar4 = VariableNameToRuntimeID(this,&varName);
        BinaryWriter::Write(&this->m_writer,RVar4);
      }
      else {
        EmitOpcode(this,SetProp);
        BinaryWriter::Write(&this->m_writer,propName.m_id);
        local_d8.m_id = propName.m_id;
        pmVar3 = std::
                 map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
                 ::operator[](&this->m_idNameMap,&local_d8.m_id);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_assign
                  (pmVar3,&propName.m_name);
      }
      Expect(this,NewLine,(char *)0x0);
      goto LAB_001d0f51;
    }
    format = "Can\'t %s a readonly property";
  }
  else {
    bVar2 = CheckVariable(this);
    if (bVar2) {
      ParseVariable_abi_cxx11_((String *)&local_d8,this);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
                (&varName,(basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                          &local_d8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&local_d8)
      ;
      EmitOpcode(this,PushVar);
      RVar4 = VariableNameToRuntimeID(this,&varName);
      BinaryWriter::Write(&this->m_writer,RVar4);
      goto LAB_001d0e67;
    }
    format = "Valid property or variable name expected after %s keyword";
  }
  args = "decrement";
  if (bVar1) {
    args = "increment";
  }
  Error<char_const(&)[10]>(this,format,(char (*) [10])args);
LAB_001d0f51:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&varName);
  PropertyName::~PropertyName(&propName);
  return;
}

Assistant:

inline_t void Parser::ParseIncDec()
	{
		bool increment = Accept(SymbolType::Increment);
		if (!increment)
			Expect(SymbolType::Decrement);
		PropertyName propName;
		String varName;
		if (CheckProperty())
		{
			propName = ParsePropertyName();
			if (propName.IsReadOnly())
			{
				Error("Can't %s a readonly property", increment ? "increment" : "decrement");
				return;
			}
			EmitOpcode(Opcode::PushProp);
			EmitId(propName.GetId());
			m_idNameMap[propName.GetId()] = propName.GetName();
		}
		else if (CheckVariable())
		{
			varName = ParseVariable();
			EmitOpcode(Opcode::PushVar);
			EmitId(VariableNameToRuntimeID(varName));
		}
		else
		{
			Error("Valid property or variable name expected after %s keyword", increment ? "increment" : "decrement");
			return;
		}
		if (Accept(SymbolType::By))
		{
			ParseExpression();
		}
		else
		{
			EmitOpcode(Opcode::PushVal);
			EmitValue(1);
		}
		EmitOpcode(increment ? Opcode::Increment : Opcode::Decrement);
		if (!propName.GetName().empty())
		{
			EmitOpcode(Opcode::SetProp);
			EmitId(propName.GetId());
			m_idNameMap[propName.GetId()] = propName.GetName();
		}
		else
		{
			EmitOpcode(Opcode::SetVar);
			EmitId(VariableNameToRuntimeID(varName));
		}
		Expect(SymbolType::NewLine);
	}